

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

Element * __thiscall Rml::Element::GetClosestScrollableContainer(Element *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  do {
    uVar3 = (uint)*(undefined8 *)&(this->meta->computed_values).common;
    if ((uVar3 >> 0xb & 1) == 0) {
      bVar1 = false;
    }
    else {
      fVar4 = GetScrollWidth(this);
      fVar5 = GetClientWidth(this);
      bVar1 = fVar5 < fVar4;
    }
    if ((uVar3 >> 0xd & 1) == 0) {
      bVar2 = false;
    }
    else {
      fVar4 = GetScrollHeight(this);
      fVar5 = GetClientHeight(this);
      bVar2 = fVar5 < fVar4;
    }
    if (bVar1 || bVar2) {
      return this;
    }
    if (((this->meta->computed_values).rare.field_0x3 & 1) != 0) {
      return this;
    }
    this = this->parent;
  } while (this != (Element *)0x0);
  return (Element *)0x0;
}

Assistant:

Element* Element::GetClosestScrollableContainer()
{
	using namespace Style;

	Overflow overflow_x = meta->computed_values.overflow_x();
	Overflow overflow_y = meta->computed_values.overflow_y();
	bool scrollable_x = (overflow_x == Overflow::Auto || overflow_x == Overflow::Scroll);
	bool scrollable_y = (overflow_y == Overflow::Auto || overflow_y == Overflow::Scroll);

	scrollable_x = (scrollable_x && GetScrollWidth() > GetClientWidth());
	scrollable_y = (scrollable_y && GetScrollHeight() > GetClientHeight());

	if (scrollable_x || scrollable_y || meta->computed_values.overscroll_behavior() == OverscrollBehavior::Contain)
		return this;
	else if (parent)
		return parent->GetClosestScrollableContainer();

	return nullptr;
}